

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O1

uint64_t helper_packsshb_mips64el(uint64_t fs,uint64_t ft)

{
  ulong uVar1;
  byte bVar2;
  long lVar3;
  byte bVar4;
  short sVar5;
  
  lVar3 = 0;
  bVar4 = 0;
  uVar1 = 0;
  do {
    sVar5 = (short)(fs >> (bVar4 & 0x3f));
    if (0x7e < sVar5) {
      sVar5 = 0x7f;
    }
    bVar2 = (byte)sVar5;
    if (sVar5 < -0x7f) {
      bVar2 = 0x80;
    }
    uVar1 = uVar1 | (ulong)bVar2 << ((byte)lVar3 & 0x3f);
    bVar4 = bVar4 + 0x10;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x20);
  bVar4 = 0x20;
  lVar3 = 0;
  do {
    sVar5 = (short)(ft >> ((byte)lVar3 & 0x3f));
    if (0x7e < sVar5) {
      sVar5 = 0x7f;
    }
    bVar2 = (byte)sVar5;
    if (sVar5 < -0x7f) {
      bVar2 = 0x80;
    }
    uVar1 = uVar1 | (ulong)bVar2 << (bVar4 & 0x3f);
    lVar3 = lVar3 + 0x10;
    bVar4 = bVar4 + 8;
  } while (lVar3 != 0x40);
  return uVar1;
}

Assistant:

uint64_t helper_packsshb(uint64_t fs, uint64_t ft)
{
    uint64_t fd = 0;
    unsigned int i;

    for (i = 0; i < 4; ++i) {
        int16_t tmp = fs >> (i * 16);
        tmp = SATSB(tmp);
        fd |= (uint64_t)(tmp & 0xff) << (i * 8);
    }
    for (i = 0; i < 4; ++i) {
        int16_t tmp = ft >> (i * 16);
        tmp = SATSB(tmp);
        fd |= (uint64_t)(tmp & 0xff) << (i * 8 + 32);
    }

    return fd;
}